

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O2

void check_string(archive *a,archive_mstring *mstr,archive_string_conv *sc,char *exp,wchar_t *wexp)

{
  size_t v1;
  wchar_t wVar1;
  size_t v2;
  size_t len;
  wchar_t *wp;
  char *p;
  archive_mstring mstr2;
  size_t local_b0;
  wchar_t *local_a8;
  char *local_a0;
  archive_mstring local_98;
  
  local_a0 = (char *)0x0;
  local_a8 = (wchar_t *)0x0;
  local_b0 = 0;
  local_98.aes_mbs.s = (char *)0x0;
  local_98.aes_mbs.length = 0;
  local_98.aes_mbs.buffer_length = 0;
  local_98.aes_utf8.s = (char *)0x0;
  local_98.aes_utf8.length = 0;
  local_98.aes_utf8.buffer_length = 0;
  local_98.aes_wcs.s = (wchar_t *)0x0;
  local_98.aes_wcs.length = 0;
  local_98.aes_wcs.buffer_length = 0;
  local_98.aes_mbs_in_locale.s = (char *)0x0;
  local_98.aes_mbs_in_locale.length = 0;
  local_98.aes_mbs_in_locale.buffer_length = 0;
  local_98.aes_set = L'\0';
  local_98._100_4_ = 0;
  archive_mstring_copy(&local_98,mstr);
  wVar1 = archive_mstring_get_mbs((archive_conflict *)a,&local_98,&local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̗',0,"0",(long)wVar1,"archive_mstring_get_mbs(a, &mstr2, &p)",(void *)0x0)
  ;
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̘',exp,"exp",local_a0,"p",(void *)0x0,L'\0');
  local_a0 = (char *)0x0;
  archive_mstring_copy(&local_98,mstr);
  wVar1 = archive_mstring_get_utf8((archive_conflict *)a,&local_98,&local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̜',0,"0",(long)wVar1,"archive_mstring_get_utf8(a, &mstr2, &p)",(void *)0x0
                     );
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̝',exp,"exp",local_a0,"p",(void *)0x0,L'\0');
  local_a0 = (char *)0x0;
  archive_mstring_copy(&local_98,mstr);
  wVar1 = archive_mstring_get_wcs((archive_conflict *)a,&local_98,&local_a8);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̡',0,"0",(long)wVar1,"archive_mstring_get_wcs(a, &mstr2, &wp)",(void *)0x0
                     );
  assertion_equal_wstring
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̢',wexp,"wexp",local_a8,"wp",(void *)0x0);
  local_a8 = (wchar_t *)0x0;
  archive_mstring_copy(&local_98,mstr);
  wVar1 = archive_mstring_get_mbs_l((archive_conflict *)a,&local_98,&local_a0,&local_b0,sc);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̦',0,"0",(long)wVar1,"archive_mstring_get_mbs_l(a, &mstr2, &p, &len, sc)",
                      (void *)0x0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̧',exp,"exp",local_a0,"p",(void *)0x0,L'\0');
  v1 = local_b0;
  v2 = strlen(exp);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̨',v1,"len",v2,"strlen(exp)",(void *)0x0);
  local_a0 = (char *)0x0;
  local_b0 = 0;
  archive_mstring_clean(&local_98);
  return;
}

Assistant:

static void
check_string(struct archive *a, struct archive_mstring *mstr, struct archive_string_conv *sc,
  const char *exp, const wchar_t *wexp)
{
	/* Do all the tests on a copy so that we can have a clear initial state every time */
	struct archive_mstring mstr2;
	const char *p = NULL;
	const wchar_t *wp = NULL;
	size_t len = 0;

	memset(&mstr2, 0, sizeof(mstr2));

	archive_mstring_copy(&mstr2, mstr);
	assertEqualInt(0, archive_mstring_get_mbs(a, &mstr2, &p));
	assertEqualString(exp, p);
	p = NULL;

	archive_mstring_copy(&mstr2, mstr);
	assertEqualInt(0, archive_mstring_get_utf8(a, &mstr2, &p));
	assertEqualString(exp, p);
	p = NULL;

	archive_mstring_copy(&mstr2, mstr);
	assertEqualInt(0, archive_mstring_get_wcs(a, &mstr2, &wp));
	assertEqualWString(wexp, wp);
	wp = NULL;

	archive_mstring_copy(&mstr2, mstr);
	assertEqualInt(0, archive_mstring_get_mbs_l(a, &mstr2, &p, &len, sc));
	assertEqualString(exp, p);
	assertEqualInt(len, strlen(exp));
	p = NULL;
	len = 0;

	archive_mstring_clean(&mstr2);
}